

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_comm.c
# Opt level: O1

void do_cb(CHAR_DATA *ch,char *argument)

{
  ulong uVar1;
  DESCRIPTOR_DATA *pDVar2;
  bool bVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  uint uVar7;
  long lVar8;
  char **ppcVar9;
  char cVar10;
  char cVar11;
  char *pcVar12;
  char buf [4608];
  char local_1238 [4616];
  
  bVar3 = is_affected_area(ch->in_room->area,(int)gsn_interference);
  if (bVar3) {
    pcVar12 = "The electrical currents in the area block your attempt to communicate.\n\r";
  }
  else {
    bVar3 = is_cabal(ch);
    if ((bVar3) && (cabal_table[ch->cabal].independent != true)) {
      if (*argument == '\0') {
        if ((ch->comm[0] & 0x80) == 0) {
          send_to_char("Cabal channel is now OFF\n\r",ch);
          *(byte *)ch->comm = (byte)ch->comm[0] | 0x80;
        }
        else {
          send_to_char("Cabal channel is now ON\n\r",ch);
          *(byte *)ch->comm = (byte)ch->comm[0] & 0x7f;
        }
        return;
      }
      bVar3 = is_shifted(ch);
      if ((!bVar3) || (bVar3 = is_immortal(ch), bVar3)) {
        bVar3 = is_affected(ch,(int)gsn_silence);
        if ((bVar3) || ((ch->in_room->room_flags[0] & 0x200000) != 0)) {
          pcVar12 = "You cannot find the words within you.\n\r";
        }
        else if ((ch->comm[0] & 0x400000) == 0) {
          bVar3 = is_affected(ch,(int)gsn_imprisonvoice);
          if (bVar3) {
            pcVar12 = "Your vocal cords are frozen solid!\n\r";
          }
          else {
            bVar3 = is_affected(ch,(int)gsn_gag);
            if (!bVar3) {
              check_ooc(ch,argument,"CB");
              bVar3 = is_affected(ch,(int)gsn_deafen);
              if (bVar3) {
                cVar10 = *argument;
                pcVar12 = upstring::buf;
                if (cVar10 != '\0') {
                  lVar8 = 1;
                  do {
                    cVar11 = cVar10 + -0x20;
                    if (0x19 < (byte)(cVar10 + 0x9fU)) {
                      cVar11 = cVar10;
                    }
                    *pcVar12 = cVar11;
                    pcVar12 = pcVar12 + 1;
                    cVar10 = argument[lVar8];
                  } while ((cVar10 != '\0') &&
                          (uVar7 = (uint)lVar8, lVar8 = lVar8 + 1, uVar7 < 0x11ff));
                }
                *pcVar12 = '\0';
                strcpy(argument,upstring::buf);
              }
              uVar1 = ch->comm[0];
              ch->comm[0] = uVar1 & 0xffffffffffffff7f;
              pcVar12 = cabal_table[ch->cabal].who_name;
              bVar3 = is_npc(ch);
              if (((uint)uVar1 >> 10 & 1) == 0) {
                sprintf(local_1238,"%s%s: %s\n\r",pcVar12,(&ch->name)[(ulong)bVar3 * 4],argument);
              }
              else {
                ppcVar9 = &ch->true_name;
                if (bVar3) {
                  ppcVar9 = &ch->short_descr;
                }
                pcVar4 = *ppcVar9;
                pcVar5 = get_char_color(ch,"channels");
                pcVar6 = END_COLOR(ch);
                sprintf(local_1238,"%s%s: %s%s%s\n\r",pcVar12,pcVar4,pcVar5,argument,pcVar6);
              }
              send_to_char(local_1238,ch);
              for (pDVar2 = descriptor_list; pDVar2 != (DESCRIPTOR_DATA *)0x0; pDVar2 = pDVar2->next
                  ) {
                if (((pDVar2->connected == 0) && (pDVar2->character != ch)) &&
                   (((bVar3 = is_same_cabal(ch,pDVar2->character), bVar3 &&
                     (((pDVar2->character->comm[0] & 0x80) == 0 &&
                      ((pDVar2->character->in_room->room_flags[0] & 0x200000) == 0)))) ||
                    ((pDVar2->character->comm[0] & 0x4000000) != 0)))) {
                  lVar8 = pDVar2->character->comm[0];
                  pcVar12 = cabal_table[ch->cabal].who_name;
                  bVar3 = is_npc(ch);
                  if (((uint)lVar8 >> 10 & 1) == 0) {
                    if ((bVar3) || (bVar3 = can_see(pDVar2->character,ch), !bVar3)) {
                      pcVar4 = pers(ch,pDVar2->character);
                    }
                    else {
                      pcVar4 = ch->true_name;
                    }
                    sprintf(local_1238,"%s%s: %s\n\r",pcVar12,pcVar4,argument);
                  }
                  else {
                    if ((bVar3) || (bVar3 = can_see(pDVar2->character,ch), !bVar3)) {
                      pcVar4 = pers(ch,pDVar2->character);
                    }
                    else {
                      pcVar4 = ch->true_name;
                    }
                    pcVar5 = get_char_color(pDVar2->character,"channels");
                    pcVar6 = END_COLOR(pDVar2->character);
                    sprintf(local_1238,"%s%s: %s%s%s\n\r",pcVar12,pcVar4,pcVar5,argument,pcVar6);
                  }
                  send_to_char(local_1238,pDVar2->character);
                }
              }
              return;
            }
            pcVar12 = "You are gagged and cannot speak!\n\r";
          }
        }
        else {
          pcVar12 = "The gods have revoked your channel privileges.\n\r";
        }
      }
      else {
        pcVar12 = "You can\'t seem to form the words.\n\r";
      }
    }
    else {
      pcVar12 = "You aren\'t in a cabal.\n\r";
    }
  }
  send_to_char(pcVar12,ch);
  return;
}

Assistant:

void do_cb(CHAR_DATA *ch, char *argument)
{
	if (is_affected_area(ch->in_room->area, gsn_interference))
	{
		send_to_char("The electrical currents in the area block your attempt to communicate.\n\r", ch);
		return;
	}

	if (!is_cabal(ch) || cabal_table[ch->cabal].independent)
	{
		send_to_char("You aren't in a cabal.\n\r", ch);
		return;
	}

	if (argument[0] == '\0')
	{
		if (IS_SET(ch->comm, COMM_NOCABAL))
		{
			send_to_char("Cabal channel is now ON\n\r", ch);
			REMOVE_BIT(ch->comm, COMM_NOCABAL);
		}
		else
		{
			send_to_char("Cabal channel is now OFF\n\r", ch);
			SET_BIT(ch->comm, COMM_NOCABAL);
		}

		return;
	}

	if (is_shifted(ch) && !is_immortal(ch))
	{
		send_to_char("You can't seem to form the words.\n\r", ch);
		return;
	}

	if (is_affected(ch, gsn_silence))
	{
		send_to_char("You cannot find the words within you.\n\r", ch);
		return;
	}

	if (IS_SET(ch->in_room->room_flags, ROOM_SILENCE))
	{
		send_to_char("You cannot find the words within you.\n\r", ch);
		return;
	}

	if (IS_SET(ch->comm, COMM_NOCHANNELS))
	{
		send_to_char("The gods have revoked your channel privileges.\n\r", ch);
		return;
	}

	if (is_affected(ch, gsn_imprisonvoice))
	{
		send_to_char("Your vocal cords are frozen solid!\n\r", ch);
		return;
	}

	if (is_affected(ch, gsn_gag))
	{
		send_to_char("You are gagged and cannot speak!\n\r", ch);
		return;
	}

	check_ooc(ch, argument, "CB");

	if (is_affected(ch, gsn_deafen))
		sprintf(argument, "%s", upstring(argument));

	REMOVE_BIT(ch->comm, COMM_NOCABAL);

	char buf[MAX_STRING_LENGTH];
	if (IS_SET(ch->comm, COMM_ANSI))
	{
		sprintf(buf, "%s%s: %s%s%s\n\r",
				cabal_table[ch->cabal].who_name,
				is_npc(ch) ? ch->short_descr : ch->true_name,
				get_char_color(ch, "channels"),
				argument,
				END_COLOR(ch));
	}
	else
	{
		sprintf(buf, "%s%s: %s\n\r",
				cabal_table[ch->cabal].who_name,
				is_npc(ch) ? ch->short_descr : ch->name,
				argument);
	}

	send_to_char(buf, ch);

	for (auto d = descriptor_list; d != nullptr; d = d->next)
	{
		if (d->connected == CON_PLAYING && d->character != ch && ((is_same_cabal(ch, d->character) && !IS_SET(d->character->comm, COMM_NOCABAL) && !IS_SET(d->character->in_room->room_flags, ROOM_SILENCE)) || IS_SET(d->character->comm, COMM_ALL_CABALS)))
		{
			if (IS_SET(d->character->comm, COMM_ANSI))
			{
				sprintf(buf, "%s%s: %s%s%s\n\r",
						cabal_table[ch->cabal].who_name,
						!is_npc(ch) && can_see(d->character, ch) ? ch->true_name : pers(ch, d->character),
						get_char_color(d->character, "channels"),
						argument,
						END_COLOR(d->character));
			}
			else
			{
				sprintf(buf, "%s%s: %s\n\r",
						cabal_table[ch->cabal].who_name,
						!is_npc(ch) && can_see(d->character, ch) ? ch->true_name : pers(ch, d->character),
						argument);
			}

			send_to_char(buf, d->character);
		}
	}
}